

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O3

void apply_imputation_results<PredictionData<double,unsigned_long>,ImputedData<unsigned_long,double>>
               (PredictionData<double,_unsigned_long> *prediction_data,
               ImputedData<unsigned_long,_double> *imp,Imputer *imputer,size_t row)

{
  bool bVar1;
  size_t sVar2;
  pointer puVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  unsigned_long uVar7;
  ulong uVar8;
  pointer pvVar9;
  pointer pvVar10;
  int *piVar11;
  pointer piVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  size_t sVar16;
  ulong uVar17;
  long lVar18;
  double *pdVar19;
  int iVar20;
  size_t sVar21;
  double *pdVar22;
  double dVar23;
  double dVar24;
  
  bVar1 = prediction_data->is_col_major;
  sVar2 = imp->n_missing_num;
  if (bVar1 == false) {
    if (sVar2 != 0) {
      puVar3 = (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar4 = (imp->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (imp->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar16 = imputer->ncols_numeric;
      pdVar19 = prediction_data->numeric_data;
      pdVar6 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar21 = 0;
      do {
        uVar7 = puVar3[sVar21];
        dVar24 = pdVar5[sVar21];
        if (((dVar24 <= 0.0) || (dVar23 = pdVar4[sVar21], 0x7fefffffffffffff < (ulong)ABS(dVar23)))
           || ((dVar23 == 0.0 && ((!NAN(dVar23) && (NAN(pdVar6[uVar7]))))))) {
          dVar23 = pdVar6[uVar7];
        }
        else {
          dVar23 = dVar23 / dVar24;
        }
        pdVar19[sVar16 * row + uVar7] = dVar23;
        sVar21 = sVar21 + 1;
      } while (sVar2 != sVar21);
    }
  }
  else if (sVar2 != 0) {
    puVar3 = (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar4 = (imp->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (imp->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar19 = prediction_data->numeric_data;
    sVar16 = prediction_data->nrows;
    sVar21 = 0;
    do {
      uVar7 = puVar3[sVar21];
      dVar24 = pdVar5[sVar21];
      if (((dVar24 <= 0.0) || (dVar23 = pdVar4[sVar21], 0x7fefffffffffffff < (ulong)ABS(dVar23))) ||
         ((dVar23 == 0.0 && ((!NAN(dVar23) && (NAN(pdVar6[uVar7]))))))) {
        dVar23 = pdVar6[uVar7];
      }
      else {
        dVar23 = dVar23 / dVar24;
      }
      pdVar19[row + uVar7 * sVar16] = dVar23;
      sVar21 = sVar21 + 1;
    } while (sVar2 != sVar21);
  }
  pdVar19 = prediction_data->Xr;
  if (pdVar19 != (double *)0x0) {
    uVar17 = prediction_data->Xr_indptr[row];
    uVar8 = prediction_data->Xr_indptr[row + 1];
    if (uVar17 < uVar8) {
      pdVar4 = (imp->sp_num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (imp->sp_num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (imp->missing_sp).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar6 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar18 = 0;
      do {
        if (0x7fefffffffffffff < (ulong)ABS(pdVar19[uVar17])) {
          dVar24 = pdVar5[lVar18];
          if ((dVar24 <= 0.0) || (dVar23 = pdVar4[lVar18], 0x7fefffffffffffff < (ulong)ABS(dVar23)))
          {
            dVar23 = pdVar6[puVar3[lVar18]];
          }
          else {
            dVar23 = dVar23 / dVar24;
          }
          pdVar19[uVar17] = dVar23;
          lVar18 = lVar18 + 1;
        }
        uVar17 = uVar17 + 1;
      } while (uVar8 != uVar17);
    }
  }
  sVar2 = imp->n_missing_cat;
  if (bVar1 == false) {
    if (sVar2 != 0) {
      puVar3 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar18 = row * imputer->ncols_categ;
      pvVar9 = (imp->cat_sum).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar11 = prediction_data->categ_data;
      pvVar10 = (imp->cat_sum).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      piVar12 = (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      sVar16 = 0;
      do {
        uVar7 = puVar3[sVar16];
        pdVar13 = pvVar9[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar14 = pvVar9[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pdVar19 = pdVar13 + 1;
        pdVar22 = pdVar13;
        if (pdVar19 != pdVar14 && pdVar13 != pdVar14) {
          dVar24 = *pdVar13;
          do {
            dVar23 = *pdVar19;
            pdVar15 = pdVar19;
            if (dVar23 <= dVar24) {
              dVar23 = dVar24;
              pdVar15 = pdVar22;
            }
            pdVar22 = pdVar15;
            pdVar19 = pdVar19 + 1;
            dVar24 = dVar23;
          } while (pdVar19 != pdVar14);
        }
        iVar20 = (int)((ulong)((long)pdVar22 - (long)pdVar13) >> 3);
        piVar11[lVar18 + uVar7] = iVar20;
        if (iVar20 == 0) {
          iVar20 = -1;
          if ((pdVar13 != pdVar14) && (pvVar9 != pvVar10)) {
            if (0.0 < *pdVar13) goto LAB_00250b28;
            iVar20 = piVar12[uVar7];
          }
          piVar11[lVar18 + uVar7] = iVar20;
        }
LAB_00250b28:
        sVar16 = sVar16 + 1;
      } while (sVar16 != sVar2);
    }
  }
  else if (sVar2 != 0) {
    puVar3 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pvVar9 = (imp->cat_sum).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar10 = (imp->cat_sum).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    piVar11 = prediction_data->categ_data;
    sVar16 = prediction_data->nrows;
    piVar12 = (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    sVar21 = 0;
    do {
      uVar7 = puVar3[sVar21];
      pdVar13 = pvVar9[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar14 = pvVar9[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pdVar19 = pdVar13 + 1;
      pdVar22 = pdVar13;
      if (pdVar19 != pdVar14 && pdVar13 != pdVar14) {
        dVar24 = *pdVar13;
        do {
          dVar23 = *pdVar19;
          pdVar15 = pdVar19;
          if (dVar23 <= dVar24) {
            dVar23 = dVar24;
            pdVar15 = pdVar22;
          }
          pdVar22 = pdVar15;
          pdVar19 = pdVar19 + 1;
          dVar24 = dVar23;
        } while (pdVar19 != pdVar14);
      }
      lVar18 = sVar16 * uVar7;
      iVar20 = (int)((ulong)((long)pdVar22 - (long)pdVar13) >> 3);
      piVar11[row + lVar18] = iVar20;
      if (iVar20 == 0) {
        iVar20 = -1;
        if ((pdVar13 != pdVar14) && (pvVar9 != pvVar10)) {
          if (0.0 < *pdVar13) goto LAB_00250a64;
          iVar20 = piVar12[uVar7];
        }
        piVar11[row + lVar18] = iVar20;
      }
LAB_00250a64:
      sVar21 = sVar21 + 1;
    } while (sVar21 != sVar2);
  }
  return;
}

Assistant:

void apply_imputation_results(PredictionData  &prediction_data,
                              ImputedData     &imp,
                              Imputer         &imputer,
                              size_t          row)
{
    size_t col;
    size_t pos = 0;
    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imputer.col_means[col];
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imputer.col_means[col];
        }
    }

    if (prediction_data.Xr != NULL)
        for (auto ix = prediction_data.Xr_indptr[row]; ix < prediction_data.Xr_indptr[row + 1]; ix++)
        {
            if (is_na_or_inf(prediction_data.Xr[ix]))
            {
                if (imp.sp_num_weight[pos] > 0 && !is_na_or_inf(imp.sp_num_sum[pos]))
                    prediction_data.Xr[ix]
                        =
                    imp.sp_num_sum[pos] / imp.sp_num_weight[pos];
                else
                    prediction_data.Xr[ix]
                        =
                    imputer.col_means[imp.missing_sp[pos]];
                pos++;
            }
        }

    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[row + col * prediction_data.nrows] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows] = -1;
                }

                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[col + row * imputer.ncols_categ] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ] = -1;
                }
                
                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }
}